

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

ValueType __thiscall
Js::DynamicProfileInfo::GetReturnType
          (DynamicProfileInfo *this,FunctionBody *functionBody,OpCode opcode,ProfileId callSiteId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar4;
  undefined6 in_register_00000012;
  
  if ((uint)CONCAT62(in_register_00000012,opcode) < 0xf8) {
    bVar2 = IsProfiledCallOp(opcode);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x582,"(IsProfiledCallOp(opcode))","IsProfiledCallOp(opcode)");
      if (!bVar2) goto LAB_009630bb;
      *puVar3 = 0;
    }
    if (functionBody->profiledCallSiteCount <= callSiteId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x583,"(callSiteId < functionBody->GetProfiledCallSiteCount())",
                                  "callSiteId < functionBody->GetProfiledCallSiteCount()");
      if (!bVar2) {
LAB_009630bb:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    paVar4 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)((this->callSiteInfo).ptr + callSiteId);
  }
  else {
    bVar2 = OpCodeUtil::IsProfiledReturnTypeCallOp(opcode);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x586,"(IsProfiledReturnTypeOp(opcode))",
                                  "IsProfiledReturnTypeOp(opcode)");
      if (!bVar2) goto LAB_009630bb;
      *puVar3 = 0;
    }
    if (functionBody->profiledReturnTypeCount <= callSiteId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x587,"(callSiteId < functionBody->GetProfiledReturnTypeCount())"
                                  ,"callSiteId < functionBody->GetProfiledReturnTypeCount()");
      if (!bVar2) goto LAB_009630bb;
      *puVar3 = 0;
    }
    paVar4 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
             ((long)&((this->returnTypeInfo).ptr)->field_0 + (ulong)((uint)callSiteId * 2));
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)
         *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar4->field_0;
}

Assistant:

ValueType DynamicProfileInfo::GetReturnType(FunctionBody* functionBody, Js::OpCode opcode, ProfileId callSiteId) const
    {
        if (opcode < Js::OpCode::ProfiledReturnTypeCallI)
        {
            Assert(IsProfiledCallOp(opcode));
            Assert(callSiteId < functionBody->GetProfiledCallSiteCount());
            return this->callSiteInfo[callSiteId].returnType;
        }
        Assert(IsProfiledReturnTypeOp(opcode));
        Assert(callSiteId < functionBody->GetProfiledReturnTypeCount());
        return this->returnTypeInfo[callSiteId];
    }